

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  int iVar1;
  TokenType TVar2;
  bool bVar3;
  __type _Var4;
  CppType CVar5;
  LogMessage *other;
  EnumDescriptor *this_00;
  EnumValueDescriptor *value_00;
  AlphaNum *a;
  byte bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *psVar7;
  float value_01;
  int64 value;
  char *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [2];
  int64 int_value;
  string local_f8;
  string value_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  EnumDescriptor *local_78;
  string local_70;
  string local_50;
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value;
  CVar5 = FieldDescriptor::cpp_type(field);
  switch(CVar5) {
  case CPPTYPE_INT32:
    bVar3 = ConsumeSignedInteger(this,&value,0x7fffffff);
    if (!bVar3) {
LAB_00282a72:
      bVar6 = 0;
      goto LAB_00282a74;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt32(reflection,message,field,(uint32)value);
    }
    else {
      Reflection::SetInt32(reflection,message,field,(uint32)value);
    }
    break;
  case CPPTYPE_INT64:
    bVar3 = ConsumeSignedInteger(this,&value,0x7fffffffffffffff);
    if (!bVar3) goto LAB_00282a72;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(reflection,message,field,value);
    }
    else {
      Reflection::SetInt64(reflection,message,field,value);
    }
    break;
  case CPPTYPE_UINT32:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&value,0xffffffff);
    if (!bVar3) goto LAB_00282a72;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(reflection,message,field,(uint32)value);
    }
    else {
      Reflection::SetUInt32(reflection,message,field,(uint32)value);
    }
    break;
  case CPPTYPE_UINT64:
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&value,0xffffffffffffffff);
    if (!bVar3) goto LAB_00282a72;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(reflection,message,field,value);
    }
    else {
      Reflection::SetUInt64(reflection,message,field,value);
    }
    break;
  case CPPTYPE_DOUBLE:
    bVar3 = ConsumeDouble(this,(double *)&value);
    if (!bVar3) goto LAB_00282a72;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(reflection,message,field,(double)value);
    }
    else {
      Reflection::SetDouble(reflection,message,field,(double)value);
    }
    break;
  case CPPTYPE_FLOAT:
    bVar3 = ConsumeDouble(this,(double *)&value);
    if (!bVar3) goto LAB_00282a72;
    iVar1 = *(int *)(field + 0x3c);
    value_01 = io::SafeDoubleToFloat((double)value);
    if (iVar1 == 3) {
      Reflection::AddFloat(reflection,message,field,value_01);
    }
    else {
      Reflection::SetFloat(reflection,message,field,value_01);
    }
    break;
  case CPPTYPE_BOOL:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      value = (int64)local_128;
      local_130 = (char *)0x0;
      local_128[0]._M_local_buf[0] = '\0';
      bVar3 = ConsumeIdentifier(this,(string *)&value);
      if (!bVar3) {
LAB_00282a6a:
        std::__cxx11::string::~string((string *)&value);
        goto LAB_00282a72;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value,"true");
      if (((bVar3) ||
          (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&value,"True"), bVar3)) ||
         (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&value,"t"), bVar3)) {
        bVar3 = true;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&value,"false");
        if (((!bVar3) &&
            (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&value,"False"), !bVar3)) &&
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&value,"f"), !bVar3)) {
          std::operator+(&local_b8,"Invalid value for boolean field \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          std::operator+(&local_98,&local_b8,"\". Value: \"");
          std::operator+(&local_f8,&local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                        );
          std::operator+(&value_4,&local_f8,"\".");
          ReportError(this,&value_4);
          std::__cxx11::string::~string((string *)&value_4);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          goto LAB_00282a6a;
        }
        bVar3 = false;
      }
      if (*(int *)(field + 0x3c) == 3) {
        Reflection::AddBool(reflection,message,field,bVar3);
      }
      else {
        Reflection::SetBool(reflection,message,field,bVar3);
      }
      goto LAB_002826c3;
    }
    bVar3 = ConsumeUnsignedInteger(this,(uint64 *)&value,1);
    if (!bVar3) goto LAB_00282a72;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(reflection,message,field,value != 0);
    }
    else {
      Reflection::SetBool(reflection,message,field,value != 0);
    }
    break;
  case CPPTYPE_ENUM:
    value_4._M_dataplus._M_p = (pointer)&value_4.field_2;
    value_4._M_string_length = 0;
    value_4.field_2._M_local_buf[0] = '\0';
    int_value = 0x7fffffffffffffff;
    this_00 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar3 = ConsumeIdentifier(this,&value_4);
      if (!bVar3) goto LAB_00282960;
      value_00 = EnumDescriptor::FindValueByName(this_00,&value_4);
LAB_00282750:
      if (value_00 == (EnumValueDescriptor *)0x0) {
        if ((int_value == 0x7fffffffffffffff) ||
           (bVar3 = Reflection::SupportsUnknownEnumValues(reflection), !bVar3)) {
          if (this->allow_unknown_enum_ == false) {
            std::operator+(&local_b8,"Unknown enumeration value of \"",&value_4);
            std::operator+(&local_98,&local_b8,"\" for field \"");
            std::operator+(&local_f8,&local_98,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value,&local_f8,"\".");
            ReportError(this,(string *)&value);
            std::__cxx11::string::~string((string *)&value);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_98);
            this_01 = &local_b8;
            goto LAB_0028295b;
          }
          std::operator+(&local_b8,"Unknown enumeration value of \"",&value_4);
          std::operator+(&local_98,&local_b8,"\" for field \"");
          std::operator+(&local_f8,&local_98,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                         ,&local_f8,"\".");
          ReportWarning(this,(string *)&value);
          std::__cxx11::string::~string((string *)&value);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          bVar3 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar3 = true;
          if (*(int *)(field + 0x3c) == 3) {
            Reflection::AddEnumValue(reflection,message,field,(int)int_value);
            field = (FieldDescriptor *)0x1;
          }
          else {
            Reflection::SetEnumValue(reflection,message,field,(int)int_value);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        if (*(int *)(field + 0x3c) == 3) {
          Reflection::AddEnum(reflection,message,field,value_00);
        }
        else {
          Reflection::SetEnum(reflection,message,field,value_00);
        }
        bVar3 = false;
      }
    }
    else {
      local_78 = this_00;
      std::__cxx11::string::string((string *)&value,"-",(allocator *)&local_f8);
      psVar7 = &(this->tokenizer_).current_.text;
      _Var4 = std::operator==(psVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&value);
      if (_Var4) {
        std::__cxx11::string::~string((string *)&value);
LAB_002826f1:
        bVar3 = ConsumeSignedInteger(this,&int_value,0x7fffffff);
        if (bVar3) {
          strings::AlphaNum::AlphaNum((AlphaNum *)&value,int_value);
          StrCat_abi_cxx11_(&local_f8,(protobuf *)&value,a);
          std::__cxx11::string::operator=((string *)&value_4,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          value_00 = EnumDescriptor::FindValueByNumber(local_78,(int)int_value);
          goto LAB_00282750;
        }
      }
      else {
        TVar2 = (this->tokenizer_).current_.type;
        std::__cxx11::string::~string((string *)&value);
        if (TVar2 == TYPE_INTEGER) goto LAB_002826f1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       "Expected integer or identifier, got: ",psVar7);
        ReportError(this,(string *)&value);
LAB_0028295b:
        std::__cxx11::string::~string((string *)this_01);
      }
LAB_00282960:
      bVar3 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar6 = (byte)field;
    std::__cxx11::string::~string((string *)&value_4);
    if (bVar3) goto LAB_00282a74;
    break;
  case CPPTYPE_STRING:
    value = (int64)local_128;
    local_130 = (char *)0x0;
    local_128[0]._M_local_buf[0] = '\0';
    bVar3 = ConsumeString(this,(string *)&value);
    if (!bVar3) goto LAB_00282a6a;
    if (*(int *)(field + 0x3c) == 3) {
      psVar7 = &local_50;
      std::__cxx11::string::string((string *)psVar7,(string *)&value);
      Reflection::AddString(reflection,message,field,psVar7);
    }
    else {
      psVar7 = &local_70;
      std::__cxx11::string::string((string *)psVar7,(string *)&value);
      Reflection::SetString(reflection,message,field,psVar7);
    }
    std::__cxx11::string::~string((string *)psVar7);
LAB_002826c3:
    std::__cxx11::string::~string((string *)&value);
    break;
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              ((LogMessage *)&value,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
               ,0x32c);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&value,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)&value_4,other);
    internal::LogMessage::~LogMessage((LogMessage *)&value);
  }
  bVar6 = 1;
LAB_00282a74:
  return (bool)(bVar6 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                    \
  if (field->is_repeated()) {                        \
    reflection->Add##CPPTYPE(message, field, VALUE); \
  } else {                                           \
    reflection->Set##CPPTYPE(message, field, VALUE); \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name() +
                        "\". Value: \"" + value + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64 int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              reflection->SupportsUnknownEnumValues()) {
            SET_FIELD(EnumValue, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value +
                        "\" for "
                        "field \"" +
                        field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value +
                          "\" for "
                          "field \"" +
                          field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }